

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_checkpoint.cpp
# Opt level: O0

void ConcurrentCheckpoint::NopUpdate(DuckDB *db)

{
  __int_type _Var1;
  DuckDB *in_RDI;
  size_t i;
  Connection con;
  allocator *in_stack_ffffffffffffff18;
  undefined1 __i;
  allocator *in_stack_ffffffffffffff20;
  allocator *in_stack_ffffffffffffff28;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [15];
  allocator local_99;
  string local_98 [32];
  string local_78 [31];
  allocator local_59;
  string local_58 [32];
  string local_38 [8];
  ulong local_30;
  Connection local_28 [40];
  
  duckdb::Connection::Connection(local_28,in_RDI);
  for (local_30 = 0; __i = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38), local_30 < 10;
      local_30 = local_30 + 1) {
    in_stack_ffffffffffffff28 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"BEGIN TRANSACTION",in_stack_ffffffffffffff28);
    duckdb::Connection::Query(local_38);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x784b98);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    in_stack_ffffffffffffff20 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,"UPDATE accounts SET money = money",in_stack_ffffffffffffff20);
    duckdb::Connection::Query(local_78);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x784bfc);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    in_stack_ffffffffffffff18 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"COMMIT",in_stack_ffffffffffffff18);
    duckdb::Connection::Query(local_a8);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x784c58);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  std::__atomic_base<unsigned_long>::operator++
            (&finished_threads.super___atomic_base<unsigned_long>,0);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff28);
  if (_Var1 == 10) {
    std::atomic<bool>::operator=((atomic<bool> *)in_stack_ffffffffffffff20,(bool)__i);
  }
  duckdb::Connection::~Connection(local_28);
  return;
}

Assistant:

static void NopUpdate(DuckDB *db) {
		Connection con(*db);
		for (size_t i = 0; i < 10; i++) {
			con.Query("BEGIN TRANSACTION");
			con.Query("UPDATE accounts SET money = money");
			con.Query("COMMIT");
		}
		finished_threads++;
		if (finished_threads == CONCURRENT_UPDATE_TOTAL_ACCOUNTS) {
			finished = true;
		}
	}